

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Gia_Man_t * Acb_NtkEcoSynthesize(Gia_Man_t *p)

{
  Gia_Man_t *pGVar1;
  undefined8 local_20;
  Gia_Man_t *pNew;
  int fVerbose;
  int Iter;
  Gia_Man_t *p_local;
  
  pGVar1 = Gia_ManDup(p);
  local_20 = Gia_ManAreaBalance(pGVar1,0,0,0,0);
  Gia_ManStop(pGVar1);
  for (pNew._4_4_ = 0; pNew._4_4_ < 2; pNew._4_4_ = pNew._4_4_ + 1) {
    pGVar1 = Gia_ManCompress2(local_20,1,0);
    Gia_ManStop(local_20);
    local_20 = pGVar1;
  }
  pGVar1 = Gia_ManAigSyn2(local_20,0,1,0,100,0,0,0);
  Gia_ManStop(local_20);
  local_20 = pGVar1;
  for (pNew._4_4_ = 0; pNew._4_4_ < 2; pNew._4_4_ = pNew._4_4_ + 1) {
    pGVar1 = Gia_ManCompress2(local_20,1,0);
    Gia_ManStop(local_20);
    local_20 = pGVar1;
  }
  return local_20;
}

Assistant:

Gia_Man_t * Acb_NtkEcoSynthesize( Gia_Man_t * p )
{
    int Iter, fVerbose = 0;
    Gia_Man_t * pNew = Gia_ManDup( p );

    if ( fVerbose ) printf( "M_quo: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    pNew = Gia_ManAreaBalance( p = pNew, 0, 0, 0, 0 );
    Gia_ManStop( p );

    if ( fVerbose ) printf( "M_bal: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    for ( Iter = 0; Iter < 2; Iter++ )
    {
        pNew = Gia_ManCompress2( p = pNew, 1, 0 );
        Gia_ManStop( p );

        if ( fVerbose ) printf( "M_dc2: " );
        if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );
    }

    pNew = Gia_ManAigSyn2( p = pNew, 0, 1, 0, 100, 0, 0, 0 );
    Gia_ManStop( p );

    if ( fVerbose ) printf( "M_sn2: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    for ( Iter = 0; Iter < 2; Iter++ )
    {
        pNew = Gia_ManCompress2( p = pNew, 1, 0 );
        Gia_ManStop( p );

        if ( fVerbose ) printf( "M_dc2: " );
        if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );
    }
    return pNew;
}